

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void output_yydefred(void)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  uVar1 = *defred - 2;
  if (*defred == 0) {
    uVar1 = 0;
  }
  fprintf((FILE *)output_file,"int %sdefred[] = {%39d,",symbol_prefix,(ulong)uVar1);
  iVar2 = 10;
  for (lVar3 = 1; lVar3 < nstates; lVar3 = lVar3 + 1) {
    if (iVar2 < 10) {
      iVar2 = iVar2 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      iVar2 = 1;
    }
    uVar1 = defred[lVar3] - 2;
    if (defred[lVar3] == 0) {
      uVar1 = 0;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)uVar1);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  return;
}

Assistant:

void output_yydefred()
{
    register int i, j;

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %sdefred[] = {%39d,", symbol_prefix,
	    (defred[0] ? defred[0] - 2 : 0));

    j = 10;
    for (i = 1; i < nstates; i++)
    {
	if (j < 10)
	    ++j;
	else
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}

	fprintf(output_file, "%5d,", (defred[i] ? defred[i] - 2 : 0));
    }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
}